

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.c
# Opt level: O0

void handle_device_fd(int fd)

{
  int iVar1;
  ssize_t sVar2;
  int in_EDI;
  uevent uevent;
  int n;
  char msg [1026];
  uevent *in_stack_fffffffffffffbd0;
  uevent *in_stack_fffffffffffffbd8;
  char *in_stack_fffffffffffffbe0;
  undefined1 local_408 [72];
  uevent *in_stack_fffffffffffffc40;
  
  while( true ) {
    sVar2 = recv(in_EDI,local_408,0x400,0);
    iVar1 = (int)sVar2;
    if (iVar1 < 1) break;
    if (iVar1 != 0x400) {
      local_408[iVar1] = 0;
      local_408[iVar1 + 1] = 0;
      parse_event(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      handle_device_event(in_stack_fffffffffffffc40);
      handle_firmware_event(in_stack_fffffffffffffbd0);
    }
  }
  return;
}

Assistant:

void handle_device_fd(int fd)
{
    char msg[UEVENT_MSG_LEN+2];
    int n;

    while((n = recv(fd, msg, UEVENT_MSG_LEN, 0)) > 0) {
        struct uevent uevent;

        if(n == UEVENT_MSG_LEN)   /* overflow -- discard */
            continue;

        msg[n] = '\0';
        msg[n+1] = '\0';

        parse_event(msg, &uevent);

        handle_device_event(&uevent);
        handle_firmware_event(&uevent);
    }
}